

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.cpp
# Opt level: O2

vector<double,_std::allocator<double>_> * __thiscall
TasGrid::GridLocalPolynomial::getCandidateConstructionPoints<(TasGrid::RuleLocal::erule)1>
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,GridLocalPolynomial *this
          ,double tolerance,TypeRefinement criteria,int output,
          vector<int,_std::allocator<int>_> *level_limits,double *scale_correction)

{
  SimpleConstructData *pSVar1;
  GridLocalPolynomial *pGVar2;
  vector<double,_std::allocator<double>_> *pvVar3;
  int iVar4;
  int iVar5;
  int i_2;
  int *piVar6;
  int *p_1;
  _Fwd_list_impl _Var7;
  int i_3;
  int i_1;
  size_t sVar8;
  pointer piVar9;
  int i;
  long lVar10;
  pointer piVar11;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  anon_class_16_2_32987795 apply;
  allocator_type local_191;
  GridLocalPolynomial *local_190;
  pointer local_188;
  pointer local_180;
  double local_178;
  int output_local;
  vector<int,_std::allocator<int>_> initial_levels;
  forward_list<TasGrid::NodeData,_std::allocator<TasGrid::NodeData>_> weighted_points;
  _Fwd_list_impl local_148;
  vector<int,_std::allocator<int>_> p;
  vector<double,_std::allocator<double>_> local_118;
  MultiIndexSet new_points;
  vector<double,_std::allocator<double>_> refine_weights;
  Wrapper2D<const_double> local_c0;
  vector<double,_std::allocator<double>_> *local_b0;
  vector<double,_std::allocator<double>_> default_scale;
  anon_class_32_4_cc64a04a getDominantSurplus;
  vector<double,_std::allocator<double>_> norm;
  MultiIndexSet refine_candidates;
  
  output_local = output;
  getRefinementCanidates<(TasGrid::RuleLocal::erule)1>
            (&refine_candidates,this,tolerance,criteria,output,level_limits,scale_correction);
  pSVar1 = (this->dynamic_values)._M_t.
           super___uniq_ptr_impl<TasGrid::SimpleConstructData,_std::default_delete<TasGrid::SimpleConstructData>_>
           ._M_t.
           super__Tuple_impl<0UL,_TasGrid::SimpleConstructData_*,_std::default_delete<TasGrid::SimpleConstructData>_>
           .super__Head_base<0UL,_TasGrid::SimpleConstructData_*,_false>._M_head_impl;
  if ((pSVar1->initial_points).indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start == *(pointer *)((long)&(pSVar1->initial_points).indexes + 8))
  {
    MultiIndexSet::MultiIndexSet(&new_points,&refine_candidates);
  }
  else {
    MultiIndexSet::operator-(&new_points,&refine_candidates,&pSVar1->initial_points);
  }
  getNormalization(&norm,this);
  if (output_local == -1) {
    iVar4 = (this->super_BaseCanonicalGrid).num_outputs;
  }
  else {
    iVar4 = 1;
  }
  sVar8 = (size_t)iVar4;
  default_scale.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  default_scale.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  default_scale.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_190 = this;
  local_c0.data = scale_correction;
  local_b0 = __return_storage_ptr__;
  if (scale_correction == (double *)0x0) {
    getDominantSurplus.this = (GridLocalPolynomial *)0x3ff0000000000000;
    local_c0.stride = sVar8;
    ::std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&p,
               (long)(this->super_BaseCanonicalGrid).points.cache_num_indexes * sVar8,
               (value_type_conflict2 *)&getDominantSurplus,(allocator_type *)&refine_weights);
    ::std::vector<double,_std::allocator<double>_>::_M_move_assign
              ((vector<double,_std::allocator<double>_> *)&default_scale,
               (_Vector_base<double,_std::allocator<double>_> *)&p);
    ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&p);
    local_c0.data =
         default_scale.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  pGVar2 = local_190;
  local_180 = (pointer)CONCAT44(local_180._4_4_,criteria);
  getDominantSurplus.this = local_190;
  getDominantSurplus.scale = &local_c0;
  getDominantSurplus.output = &output_local;
  local_c0.stride = sVar8;
  getDominantSurplus.norm = &norm;
  ::std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&refine_weights,
             (long)new_points.cache_num_indexes,(allocator_type *)&p);
  for (lVar10 = 0; lVar10 < new_points.cache_num_indexes; lVar10 = lVar10 + 1) {
    initial_levels.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    MultiIndexSet::copyIndex((vector<int,_std::allocator<int>_> *)&p,&new_points,(int)lVar10);
    apply.getDominantSurplus = (anon_class_32_4_cc64a04a *)level_limits;
    apply.weight = (double *)&getDominantSurplus;
    HierarchyManipulations::
    touchAllImmediateRelatives<(TasGrid::RuleLocal::erule)1,TasGrid::GridLocalPolynomial::getCandidateConstructionPoints<(TasGrid::RuleLocal::erule)1>(double,TasGrid::TypeRefinement,int,std::vector<int,std::allocator<int>>const&,double_const*)::_lambda(int)_2_>
              ((HierarchyManipulations *)&p,
               (vector<int,_std::allocator<int>_> *)&(pGVar2->super_BaseCanonicalGrid).points,
               (MultiIndexSet *)&initial_levels,apply);
    refine_weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[lVar10] =
         (double)initial_levels.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
    ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&p);
  }
  if (((uint)local_180 & 0xfffffffd) == 1 &&
      new_points.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      new_points.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    HierarchyManipulations::computeLevels<(TasGrid::RuleLocal::erule)1>
              ((vector<int,_std::allocator<int>_> *)&p,&new_points);
    HierarchyManipulations::splitByLevels
              ((vector<TasGrid::Data2D<int>,_std::allocator<TasGrid::Data2D<int>_>_> *)
               &initial_levels,&new_points,(vector<int,_std::allocator<int>_> *)&p);
    while (initial_levels.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish !=
           initial_levels.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start) {
      piVar11 = initial_levels.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + -10;
      local_188 = initial_levels.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      for (lVar10 = 0;
          initial_levels.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = piVar11, lVar10 < local_188[-8]; lVar10 = lVar10 + 1)
      {
        piVar6 = (int *)(*(long *)(local_188 + -10) * lVar10 * 4 + *(long *)(local_188 + -6));
        ::std::vector<int,std::allocator<int>>::vector<int*,void>
                  ((vector<int,std::allocator<int>> *)&weighted_points,piVar6,
                   piVar6 + (local_190->super_BaseCanonicalGrid).num_dimensions,
                   (allocator_type *)&local_178);
        iVar4 = MultiIndexSet::getSlot
                          (&new_points,
                           (int *)weighted_points.
                                  super__Fwd_list_base<TasGrid::NodeData,_std::allocator<TasGrid::NodeData>_>
                                  ._M_impl._M_head._M_next);
        local_180 = (pointer)refine_weights.super__Vector_base<double,_std::allocator<double>_>.
                             _M_impl.super__Vector_impl_data._M_start[iVar4];
        for (_Var7._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base)weighted_points;
            _Var7._M_head._M_next != local_148._M_head._M_next;
            _Var7._M_head._M_next = (_Fwd_list_node_base)((long)_Var7._M_head._M_next + 4)) {
          iVar4 = *(int *)_Var7._M_head._M_next;
          iVar5 = (iVar4 + 1) / 2 - (uint)(iVar4 < 4);
          *(int *)_Var7._M_head._M_next = iVar5;
          if ((iVar5 != -1) &&
             (iVar5 = MultiIndexSet::getSlot
                                (&new_points,
                                 (int *)weighted_points.
                                        super__Fwd_list_base<TasGrid::NodeData,_std::allocator<TasGrid::NodeData>_>
                                        ._M_impl._M_head._M_next), iVar5 != -1)) {
            refine_weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[iVar5] =
                 refine_weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar5] + (double)local_180;
          }
          *(int *)_Var7._M_head._M_next = iVar4;
        }
        ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)&weighted_points);
      }
    }
  }
  else {
    if ((uint)local_180 != 4 ||
        new_points.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start ==
        new_points.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish) goto LAB_0018f667;
    HierarchyManipulations::computeLevels<(TasGrid::RuleLocal::erule)1>
              ((vector<int,_std::allocator<int>_> *)&p,&new_points);
    HierarchyManipulations::splitByLevels
              ((vector<TasGrid::Data2D<int>,_std::allocator<TasGrid::Data2D<int>_>_> *)
               &initial_levels,&new_points,(vector<int,_std::allocator<int>_> *)&p);
    local_188 = (pointer)0x0;
    piVar11 = local_188;
    while (local_188 = piVar11,
          piVar9 = initial_levels.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,
          piVar9 != initial_levels.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start) {
      piVar11 = local_188;
      for (lVar10 = 0;
          initial_levels.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = piVar9 + -10, lVar10 < piVar9[-8]; lVar10 = lVar10 + 1
          ) {
        piVar6 = (int *)(*(long *)(piVar9 + -10) * lVar10 * 4 + *(long *)(piVar9 + -6));
        local_180 = piVar11;
        ::std::vector<int,std::allocator<int>>::vector<int*,void>
                  ((vector<int,std::allocator<int>> *)&weighted_points,piVar6,
                   piVar6 + (local_190->super_BaseCanonicalGrid).num_dimensions,
                   (allocator_type *)&local_178);
        iVar4 = MultiIndexSet::getSlot
                          (&new_points,
                           (int *)weighted_points.
                                  super__Fwd_list_base<TasGrid::NodeData,_std::allocator<TasGrid::NodeData>_>
                                  ._M_impl._M_head._M_next);
        ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)&weighted_points);
        piVar11 = (pointer)(refine_weights.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start[iVar4] + (double)local_188);
        refine_weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[iVar4] = (double)piVar11;
        if ((double)piVar11 <= (double)local_180) {
          piVar11 = local_180;
        }
      }
    }
  }
  ::std::vector<TasGrid::Data2D<int>,_std::allocator<TasGrid::Data2D<int>_>_>::~vector
            ((vector<TasGrid::Data2D<int>,_std::allocator<TasGrid::Data2D<int>_>_> *)&initial_levels
            );
  ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&p);
LAB_0018f667:
  HierarchyManipulations::computeLevels<(TasGrid::RuleLocal::erule)1>
            ((vector<int,_std::allocator<int>_> *)&initial_levels,
             &((local_190->dynamic_values)._M_t.
               super___uniq_ptr_impl<TasGrid::SimpleConstructData,_std::default_delete<TasGrid::SimpleConstructData>_>
               ._M_t.
               super__Tuple_impl<0UL,_TasGrid::SimpleConstructData_*,_std::default_delete<TasGrid::SimpleConstructData>_>
               .super__Head_base<0UL,_TasGrid::SimpleConstructData_*,_false>._M_head_impl)->
              initial_points);
  weighted_points.super__Fwd_list_base<TasGrid::NodeData,_std::allocator<TasGrid::NodeData>_>.
  _M_impl._M_head._M_next =
       (_Fwd_list_base<TasGrid::NodeData,_std::allocator<TasGrid::NodeData>_>)(_Fwd_list_impl)0x0;
  for (lVar10 = 0;
      pSVar1 = (local_190->dynamic_values)._M_t.
               super___uniq_ptr_impl<TasGrid::SimpleConstructData,_std::default_delete<TasGrid::SimpleConstructData>_>
               ._M_t.
               super__Tuple_impl<0UL,_TasGrid::SimpleConstructData_*,_std::default_delete<TasGrid::SimpleConstructData>_>
               .super__Head_base<0UL,_TasGrid::SimpleConstructData_*,_false>._M_head_impl,
      lVar10 < (pSVar1->initial_points).cache_num_indexes; lVar10 = lVar10 + 1) {
    MultiIndexSet::copyIndex
              ((vector<int,_std::allocator<int>_> *)&p,&pSVar1->initial_points,(int)lVar10);
    local_178 = -1.0 / (double)initial_levels.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[lVar10];
    __l._M_len = 1;
    __l._M_array = &local_178;
    ::std::vector<double,_std::allocator<double>_>::vector(&local_118,__l,&local_191);
    ::std::forward_list<TasGrid::NodeData,_std::allocator<TasGrid::NodeData>_>::push_front
              ((forward_list<TasGrid::NodeData,_std::allocator<TasGrid::NodeData>_> *)
               &weighted_points,(NodeData *)&p);
    NodeData::~NodeData((NodeData *)&p);
  }
  for (lVar10 = 0; lVar10 < new_points.cache_num_indexes; lVar10 = lVar10 + 1) {
    MultiIndexSet::copyIndex((vector<int,_std::allocator<int>_> *)&p,&new_points,(int)lVar10);
    local_178 = 1.0 / refine_weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar10];
    __l_00._M_len = 1;
    __l_00._M_array = &local_178;
    ::std::vector<double,_std::allocator<double>_>::vector(&local_118,__l_00,&local_191);
    ::std::forward_list<TasGrid::NodeData,_std::allocator<TasGrid::NodeData>_>::push_front
              ((forward_list<TasGrid::NodeData,_std::allocator<TasGrid::NodeData>_> *)
               &weighted_points,(NodeData *)&p);
    NodeData::~NodeData((NodeData *)&p);
  }
  ::std::forward_list<TasGrid::NodeData,std::allocator<TasGrid::NodeData>>::
  sort<TasGrid::GridLocalPolynomial::getCandidateConstructionPoints<(TasGrid::RuleLocal::erule)1>(double,TasGrid::TypeRefinement,int,std::vector<int,std::allocator<int>>const&,double_const*)::_lambda(TasGrid::NodeData_const&,TasGrid::NodeData_const&)_1_>
            (&weighted_points);
  pvVar3 = local_b0;
  listToLocalNodes<TasGrid::GridLocalPolynomial::getCandidateConstructionPoints<(TasGrid::RuleLocal::erule)1>(double,TasGrid::TypeRefinement,int,std::vector<int,std::allocator<int>>const&,double_const*)::_lambda(int)_3_>
            (local_b0,(TasGrid *)&weighted_points,
             (long)(local_190->super_BaseCanonicalGrid).num_dimensions);
  ::std::_Fwd_list_base<TasGrid::NodeData,_std::allocator<TasGrid::NodeData>_>::~_Fwd_list_base
            ((_Fwd_list_base<TasGrid::NodeData,_std::allocator<TasGrid::NodeData>_> *)
             &weighted_points);
  ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&initial_levels);
  ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&refine_weights);
  ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&default_scale);
  ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&norm);
  ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&new_points.indexes.super__Vector_base<int,_std::allocator<int>_>);
  ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&refine_candidates.indexes.super__Vector_base<int,_std::allocator<int>_>);
  return pvVar3;
}

Assistant:

std::vector<double> GridLocalPolynomial::getCandidateConstructionPoints(double tolerance, TypeRefinement criteria, int output,
                                                                        std::vector<int> const &level_limits, double const *scale_correction){
    // combine the initial points with negative weights and the refinement candidates with surplus weights (no need to normalize, the sort uses relative values)
    MultiIndexSet refine_candidates = getRefinementCanidates<effrule>(tolerance, criteria, output, level_limits, scale_correction);
    MultiIndexSet new_points = (dynamic_values->initial_points.empty()) ? std::move(refine_candidates) : refine_candidates - dynamic_values->initial_points;

    // compute the weights for the new_points points
    std::vector<double> norm = getNormalization();

    int active_outputs = (output == -1) ? num_outputs : 1;
    Utils::Wrapper2D<double const> scale(active_outputs, scale_correction);
    std::vector<double> default_scale;
    if (scale_correction == nullptr){ // if no scale provided, assume default 1.0
        default_scale = std::vector<double>(Utils::size_mult(active_outputs, points.getNumIndexes()), 1.0);
        scale = Utils::Wrapper2D<double const>(active_outputs, default_scale.data());
    }

    auto getDominantSurplus = [&](int i)-> double{
        double dominant = 0.0;
        const double *s = surpluses.getStrip(i);
        const double *c = scale.getStrip(i);
        if (output == -1){
            for(int k=0; k<num_outputs; k++) dominant = std::max(dominant, c[k] * std::abs(s[k]) / norm[k]);
        }else{
            dominant = c[0] * std::abs(s[output]) / norm[output];
        }
        return dominant;
    };

    std::vector<double> refine_weights(new_points.getNumIndexes());

    #pragma omp parallel for
    for(int i=0; i<new_points.getNumIndexes(); i++){
        double weight = 0.0;
        std::vector<int> p = new_points.copyIndex(i);

        HierarchyManipulations::touchAllImmediateRelatives<effrule>(p, points,
                [&](int relative)->void{ weight = std::max(weight, getDominantSurplus(relative)); });
        refine_weights[i] = weight; // those will be inverted
    }

    // if using stable refinement, ensure the weight of the parents is never less than the children
    if (!new_points.empty() && ((criteria == refine_parents_first) || (criteria == refine_fds))){
        auto rlevels = HierarchyManipulations::computeLevels<effrule>(new_points);
        auto split = HierarchyManipulations::splitByLevels(new_points, rlevels);
        for(auto is = split.rbegin(); is != split.rend(); is++){
            for(int i=0; i<is->getNumStrips(); i++){
                std::vector<int> parent(is->getStrip(i), is->getStrip(i) + num_dimensions);
                double correction = refine_weights[new_points.getSlot(parent)]; // will never be missing
                for(auto &p : parent){
                    int r = p;
                    p = RuleLocal::getParent<effrule>(r);
                    int ip = (p == -1) ? -1 : new_points.getSlot(parent); // if parent is among the refined
                    if (ip != -1) refine_weights[ip] += correction;
                    p = RuleLocal::getStepParent<effrule>(r);
                    ip = (p == -1) ? -1 : new_points.getSlot(parent); // if parent is among the refined
                    if (ip != -1) refine_weights[ip] += correction;
                    p = r;
                }
            }
        }
    }else if (!new_points.empty() && (criteria == refine_stable)){
        // stable refinement, ensure that if level[i] < level[j] then weight[i] > weight[j]
        auto rlevels = HierarchyManipulations::computeLevels<effrule>(new_points);
        auto split = HierarchyManipulations::splitByLevels(new_points, rlevels);
        double max_weight = 0.0;
        for(auto is = split.rbegin(); is != split.rend(); is++){ // loop backwards in levels
            double correction = max_weight;
            for(int i=0; i<is->getNumStrips(); i++){
                int idx = new_points.getSlot(std::vector<int>(is->getStrip(i), is->getStrip(i) + num_dimensions));
                refine_weights[idx] += correction;
                max_weight = std::max(max_weight, refine_weights[idx]);
            }
        }
    }

    // compute the weights for the initial points
    std::vector<int> initial_levels = HierarchyManipulations::computeLevels<effrule>(dynamic_values->initial_points);

    std::forward_list<NodeData> weighted_points;
    for(int i=0; i<dynamic_values->initial_points.getNumIndexes(); i++)
        weighted_points.push_front({dynamic_values->initial_points.copyIndex(i), {-1.0 / ((double) initial_levels[i])}});
    for(int i=0; i<new_points.getNumIndexes(); i++)
        weighted_points.push_front({new_points.copyIndex(i), {1.0 / refine_weights[i]}});

    // sort and return the sorted list
    weighted_points.sort([&](const NodeData &a, const NodeData &b)->bool{ return (a.value[0] < b.value[0]); });

    return listToLocalNodes(weighted_points, num_dimensions, [&](int i)->double{ return RuleLocal::getNode<effrule>(i); });
}